

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructPackCall_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,string *prefix)

{
  FieldDef *__rhs;
  StructDef *struct_def_00;
  pointer ppFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (ppFVar1 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
    __rhs = *ppFVar1;
    struct_def_00 = (__rhs->value).type.struct_def;
    if (struct_def_00 == (StructDef *)0x0) {
      std::__cxx11::string::append((char *)code_ptr);
      std::operator+(&local_70,prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::__cxx11::string::append((string *)code_ptr);
    }
    else {
      std::operator+(&local_70,prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&local_50,&local_70,"_");
      GenStructPackCall_ObjectAPI(this,struct_def_00,code_ptr,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void GenStructPackCall_ObjectAPI(const StructDef &struct_def,
                                   std::string *code_ptr,
                                   std::string prefix) const {
    auto &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      if (field_type.struct_def != nullptr) {
        GenStructPackCall_ObjectAPI(*field_type.struct_def, code_ptr,
                                    prefix + field.name + "_");
      } else {
        code += ",\n";
        code += prefix + field.name;
      }
    }
  }